

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec7Cofactor(word *t,int iVar,int fCof1,word *r)

{
  byte bVar1;
  word wVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (iVar < 0) {
    __assert_fail("iVar >= 0 && iVar < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x24b,"void If_Dec7Cofactor(word *, int, int, word *)");
  }
  if (iVar == 6) {
    if (fCof1 == 0) {
      wVar2 = *t;
    }
    else {
      wVar2 = t[1];
    }
    r[1] = wVar2;
    *r = wVar2;
    return;
  }
  uVar3 = Truth6[(uint)iVar];
  if (fCof1 == 0) {
    uVar4 = *t & ~uVar3;
    bVar1 = (byte)(1 << ((byte)iVar & 0x1f));
    *r = uVar4 << (bVar1 & 0x3f) | uVar4;
    uVar3 = ~uVar3 & t[1];
    uVar4 = uVar3 << (bVar1 & 0x3f);
  }
  else {
    uVar4 = *t & uVar3;
    bVar1 = (byte)(1 << ((byte)iVar & 0x1f));
    *r = uVar4 >> (bVar1 & 0x3f) | uVar4;
    uVar3 = uVar3 & t[1];
    uVar4 = uVar3 >> (bVar1 & 0x3f);
  }
  r[1] = uVar4 | uVar3;
  return;
}

Assistant:

static inline void If_Dec7Cofactor( word t[2], int iVar, int fCof1, word r[2] )
{
    assert( iVar >= 0 && iVar < 7 );
    if ( iVar == 6 )
    {
        if ( fCof1 )
            r[0] = r[1] = t[1];
        else
            r[0] = r[1] = t[0];
    }
    else
    {
        if ( fCof1 )
        {
            r[0] = (t[0] & Truth6[iVar]) | ((t[0] & Truth6[iVar]) >> (1<<iVar));
            r[1] = (t[1] & Truth6[iVar]) | ((t[1] & Truth6[iVar]) >> (1<<iVar));
        }
        else
        {
            r[0] = (t[0] &~Truth6[iVar]) | ((t[0] &~Truth6[iVar]) << (1<<iVar));
            r[1] = (t[1] &~Truth6[iVar]) | ((t[1] &~Truth6[iVar]) << (1<<iVar));
        }
    }
}